

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

CTcSymProp * __thiscall
CTcGramAltFuncsDyn::look_up_prop(CTcGramAltFuncsDyn *this,CTcToken *tok,int show_err)

{
  tc_symtype_t tVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  int in_EDX;
  CTcToken *in_RSI;
  long in_RDI;
  CTcSymProp *prop;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  CTcPrsSymtab *this_00;
  undefined8 local_20;
  
  this_00 = *(CTcPrsSymtab **)(in_RDI + 8);
  CTcToken::get_text(in_RSI);
  CTcToken::get_text_len(in_RSI);
  local_20 = (CTcSymProp *)
             CTcPrsSymtab::find(this_00,(textchar_t *)
                                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ),0x2de75b);
  if (local_20 == (CTcSymProp *)0x0) {
    if (in_EDX != 0) {
      sVar3 = CTcToken::get_text_len(in_RSI);
      uVar2 = (uint)sVar3;
      pcVar4 = CTcToken::get_text(in_RSI);
      CTcTokenizer::log_error(0x2b18,(ulong)uVar2,pcVar4);
    }
  }
  else {
    tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)local_20);
    if (tVar1 != TC_SYM_PROP) {
      if (in_EDX != 0) {
        sVar3 = CTcToken::get_text_len(in_RSI);
        uVar2 = (uint)sVar3;
        pcVar4 = CTcToken::get_text(in_RSI);
        CTcTokenizer::log_error(0x2b63,(ulong)uVar2,pcVar4);
      }
      local_20 = (CTcSymProp *)0x0;
    }
  }
  return local_20;
}

Assistant:

CTcSymProp *look_up_prop(const CTcToken *tok, int show_err)
    {
        /* look up the symbol */
        CTcSymProp *prop = (CTcSymProp *)symtab->find(
            tok->get_text(), tok->get_text_len());

        /* if it's already defined, make sure it's a property */
        if (prop != 0)
        {
            /* make sure it's a property */
            if (prop->get_type() != TC_SYM_PROP)
            {
                /* log an error if appropriate */
                if (show_err)
                {
                    G_tok->log_error(
                        TCERR_REDEF_AS_PROP,
                        (int)tok->get_text_len(), tok->get_text());
                }

                /* we can't use the symbol, so forget it */
                prop = 0;
            }
        }
        else
        {
            /* 
             *   undefined - we can't add it for dynamic compilation, so log
             *   an error 
             */
            if (show_err)
            {
                G_tok->log_error(
                    TCERR_UNDEF_SYM,
                    (int)tok->get_text_len(), tok->get_text());
            }
        }

        /* return the property */
        return prop;
    }